

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O3

bigint<26> * __thiscall bigint<26>::mul<13,13>(bigint<26> *this,bigint<13> *x,bigint<13> *y)

{
  digit *__s;
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  digit *pdVar5;
  ulong uVar6;
  uint uVar7;
  
  if ((x->len == 0) || ((long)y->len == 0)) {
    this->len = 0;
  }
  else {
    __s = this->digits;
    memset(__s,0,(long)y->len * 2);
    iVar2 = x->len;
    uVar1 = y->len;
    if (0 < (long)iVar2) {
      lVar4 = 0;
      pdVar5 = __s;
      do {
        uVar7 = 0;
        if (0 < (int)uVar1) {
          uVar6 = 0;
          do {
            uVar7 = pdVar5[uVar6] + uVar7 + (uint)y->digits[uVar6] * (uint)x->digits[lVar4];
            pdVar5[uVar6] = (digit)uVar7;
            uVar7 = uVar7 >> 0x10;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        __s[lVar4 + (int)uVar1] = (digit)uVar7;
        lVar4 = lVar4 + 1;
        pdVar5 = pdVar5 + 1;
      } while (lVar4 != iVar2);
    }
    iVar3 = iVar2 + uVar1;
    this->len = iVar3;
    if (iVar3 != 0) {
      lVar4 = (long)iVar3 + 1;
      iVar2 = iVar2 + uVar1;
      do {
        iVar2 = iVar2 + -1;
        if (this->digits[lVar4 + -2] != 0) {
          return this;
        }
        this->len = iVar2;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 1);
    }
  }
  return this;
}

Assistant:

bigint &mul(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        if(!x.len || !y.len) { len = 0; return *this; }
        memset(digits, 0, y.len*sizeof(digit));
        loopi(x.len)
        {
            dbldigit carry = 0;
            loopj(y.len)
            {
                carry += (dbldigit)x.digits[i] * (dbldigit)y.digits[j] + (dbldigit)digits[i+j];
                digits[i+j] = (digit)carry;
                carry >>= BI_DIGIT_BITS;
            }
            digits[i+y.len] = carry;
        }
        len = x.len + y.len;
        shrink();
        return *this;
    }